

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Register_datarep
              (char *datarep,MPIABI_Datarep_conversion_function *read_conversion_fn,
              MPIABI_Datarep_conversion_function *write_conversion_fn,
              MPIABI_Datarep_extent_function *dtype_file_extent_fn,void *extra_state)

{
  int iVar1;
  
  iVar1 = MPI_Register_datarep();
  return iVar1;
}

Assistant:

int MPIABI_Register_datarep(
    const char *datarep, MPIABI_Datarep_conversion_function *read_conversion_fn,
    MPIABI_Datarep_conversion_function *write_conversion_fn,
    MPIABI_Datarep_extent_function *dtype_file_extent_fn, void *extra_state) {
  if (sizeof(MPI_Datatype) == sizeof(MPIABI_Datatype) &&
      sizeof(MPI_Offset) == sizeof(MPIABI_Offset))
    return MPI_Register_datarep(
        datarep, (MPI_Datarep_conversion_function *)read_conversion_fn,
        (MPI_Datarep_conversion_function *)write_conversion_fn,
        (MPI_Datarep_extent_function *)dtype_file_extent_fn, extra_state);
  // There is no way to unregister a data representation, and thus no way to
  // free our internal state
  datarep_state_t *datarep_state =
      new datarep_state_t{read_conversion_fn, write_conversion_fn,
                          dtype_file_extent_fn, extra_state};
  const int ierr = MPI_Register_datarep(
      datarep, forward_read_conversion_fn, forward_write_conversion_fn,
      forward_dtype_file_extent_fn, datarep_state);
  if (ierr != MPI_SUCCESS)
    delete datarep_state;
  return ierr;
}